

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O0

ssize_t __thiscall
ovf::detail::write::file_handle::write(file_handle *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined4 in_register_00000034;
  int local_1c;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *text_local;
  file_handle *this_local;
  
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) != 0) {
    for (local_1c = 0;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_register_00000034,__fd)), (ulong)(long)local_1c < sVar2;
        local_1c = local_1c + 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_register_00000034,__fd),(long)local_1c);
      std::operator<<((ostream *)this,(string *)pvVar3);
    }
    uVar1 = std::ofstream::close();
  }
  return uVar1;
}

Assistant:

inline void file_handle::write(const std::vector<std::string> & text)
    {
        if( myfile.is_open() )
        {
            // Log(Log_Level::Debug, Log_Sender::All, "Started writing " + name);
            for (int i = 0; i < text.size(); ++i)
                myfile << text[i];

            myfile.close();
            // Log(Log_Level::Debug, Log_Sender::All, "Finished writing " + name);
        }
        else
        {
            // Log(Log_Level::Error, Log_Sender::All, "Could not open " + name + " to write to file");
        }
    }